

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDyndepCollation.cxx
# Opt level: O1

unique_ptr<cmCxxModuleExportInfo,_cmCxxModuleExportInfoDeleter> __thiscall
cmDyndepCollation::ParseExportInfo(cmDyndepCollation *this,Value *tdi)

{
  string *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>_>
  *this_01;
  pointer pcVar2;
  pointer pcVar3;
  bool bVar4;
  cmFileSetVisibility cVar5;
  void *pvVar6;
  Value *pVVar7;
  Value *pVVar8;
  mapped_type *this_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  const_iterator cVar9;
  string_view name;
  CxxModuleExport exp;
  String local_140;
  undefined1 *local_120;
  undefined8 local_118;
  Value *local_110;
  ValueHolder local_108;
  size_t local_100;
  undefined1 *local_f8;
  undefined1 local_f0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  undefined8 local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined8 local_c8;
  undefined1 *local_c0;
  ulong local_b8;
  undefined1 local_b0;
  undefined7 uStack_af;
  ulong *local_a8;
  undefined1 *local_a0;
  ulong local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  ulong *local_88;
  undefined1 *local_80;
  ulong local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  undefined1 local_68;
  undefined1 local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  SelfType local_40;
  
  pvVar6 = operator_new(0x118);
  *(undefined4 *)((long)pvVar6 + 8) = 0;
  *(undefined8 *)((long)pvVar6 + 0x10) = 0;
  *(long *)((long)pvVar6 + 0x18) = (long)pvVar6 + 8;
  *(long *)((long)pvVar6 + 0x20) = (long)pvVar6 + 8;
  *(undefined8 *)((long)pvVar6 + 0x28) = 0;
  *(undefined1 *)((long)pvVar6 + 0xd8) = 0;
  *(undefined8 *)((long)pvVar6 + 0xe0) = 0;
  *(undefined8 *)((long)pvVar6 + 0xe8) = 0;
  *(undefined8 *)((long)pvVar6 + 0xf0) = 0;
  *(long *)((long)pvVar6 + 0xf8) = (long)pvVar6 + 0x108;
  *(undefined8 *)((long)pvVar6 + 0x100) = 0;
  *(undefined1 *)((long)pvVar6 + 0x108) = 0;
  *(void **)this = pvVar6;
  local_110 = tdi;
  pVVar7 = Json::Value::operator[](tdi,"config");
  Json::Value::asString_abi_cxx11_((String *)&local_108,pVVar7);
  std::__cxx11::string::operator=((string *)((long)pvVar6 + 0xf8),(string *)&local_108.bool_);
  if (local_108 != &local_f8) {
    operator_delete(local_108.string_,(ulong)(local_f8 + 1));
  }
  if (*(long *)((long)pvVar6 + 0x100) == 0) {
    std::__cxx11::string::_M_replace((ulong)((long)pvVar6 + 0xf8),0,(char *)0x0,0x8d482c);
  }
  pVVar7 = Json::Value::operator[](local_110,"exports");
  bVar4 = Json::Value::isArray(pVVar7);
  if (bVar4) {
    cVar9 = Json::Value::begin(pVVar7);
    local_60._0_8_ = cVar9.super_ValueIteratorBase.current_._M_node;
    local_60[8] = cVar9.super_ValueIteratorBase.isNull_;
    cVar9 = Json::Value::end(pVVar7);
    local_40.current_ = cVar9.super_ValueIteratorBase.current_._M_node;
    local_40.isNull_ = cVar9.super_ValueIteratorBase.isNull_;
    paVar1 = &local_140.field_2;
    while (bVar4 = Json::ValueIteratorBase::isEqual((ValueIteratorBase *)local_60,&local_40), !bVar4
          ) {
      pVVar7 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_60);
      local_100 = 0;
      local_f8 = (undefined1 *)((ulong)local_f8 & 0xffffffffffffff00);
      local_e8 = &local_d8;
      local_e0 = 0;
      local_d8._M_local_buf[0] = '\0';
      local_c8 = &local_b8;
      local_c0 = (undefined1 *)0x0;
      local_b8 = local_b8 & 0xffffffffffffff00;
      local_a8 = &local_98;
      local_a0 = (undefined1 *)0x0;
      local_98 = local_98 & 0xffffffffffffff00;
      local_88 = &local_78;
      local_80 = (undefined1 *)0x0;
      local_78 = local_78 & 0xffffffffffffff00;
      local_108.string_ = (char *)&local_f8;
      pVVar8 = Json::Value::operator[](pVVar7,"install");
      local_68 = Json::Value::asBool(pVVar8);
      pVVar8 = Json::Value::operator[](pVVar7,"export-name");
      Json::Value::asString_abi_cxx11_(&local_140,pVVar8);
      std::__cxx11::string::operator=((string *)&local_108.bool_,(string *)&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != paVar1) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      pVVar8 = Json::Value::operator[](pVVar7,"destination");
      Json::Value::asString_abi_cxx11_(&local_140,pVVar8);
      std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != paVar1) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      pVVar8 = Json::Value::operator[](pVVar7,"export-prefix");
      Json::Value::asString_abi_cxx11_(&local_140,pVVar8);
      std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != paVar1) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      pVVar8 = Json::Value::operator[](pVVar7,"cxx-module-info-dir");
      Json::Value::asString_abi_cxx11_(&local_140,pVVar8);
      std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != paVar1) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      pVVar7 = Json::Value::operator[](pVVar7,"namespace");
      Json::Value::asString_abi_cxx11_(&local_140,pVVar7);
      std::__cxx11::string::operator=((string *)&local_88,(string *)&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != paVar1) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      std::vector<CxxModuleExport,_std::allocator<CxxModuleExport>_>::push_back
                ((vector<CxxModuleExport,_std::allocator<CxxModuleExport>_> *)(*(long *)this + 0xe0)
                 ,(value_type *)&local_108);
      if (local_88 != &local_78) {
        operator_delete(local_88,local_78 + 1);
      }
      if (local_a8 != &local_98) {
        operator_delete(local_a8,local_98 + 1);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8 + 1);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,CONCAT71(local_d8._M_allocated_capacity._1_7_,
                                          local_d8._M_local_buf[0]) + 1);
      }
      if (local_108 != &local_f8) {
        operator_delete(local_108.string_,(ulong)(local_f8 + 1));
      }
      Json::ValueIteratorBase::increment((ValueIteratorBase *)local_60);
    }
  }
  pVVar7 = Json::Value::operator[](local_110,"bmi-installation");
  bVar4 = Json::Value::isObject(pVVar7);
  if (bVar4) {
    local_100 = 0;
    local_f8 = (undefined1 *)((ulong)local_f8 & 0xffffffffffffff00);
    local_e0 = 0;
    local_d8._M_local_buf[0] = '\0';
    local_c0 = &local_b0;
    local_b8 = 0;
    local_b0 = 0;
    local_a0 = &local_90;
    local_98 = 0;
    local_90 = 0;
    local_78 = 0;
    local_70 = 0;
    local_108.string_ = (char *)&local_f8;
    local_e8 = &local_d8;
    local_80 = &local_70;
    pVVar8 = Json::Value::operator[](pVVar7,"component");
    Json::Value::asString_abi_cxx11_(&local_140,pVVar8);
    std::__cxx11::string::operator=((string *)&local_108.bool_,(string *)&local_140);
    paVar1 = &local_140.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    pVVar8 = Json::Value::operator[](pVVar7,"destination");
    Json::Value::asString_abi_cxx11_(&local_140,pVVar8);
    std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    pVVar8 = Json::Value::operator[](pVVar7,"exclude-from-all");
    bVar4 = Json::Value::asBool(pVVar8);
    local_c8 = (ulong *)CONCAT71(local_c8._1_7_,bVar4);
    pVVar8 = Json::Value::operator[](pVVar7,"optional");
    bVar4 = Json::Value::asBool(pVVar8);
    local_c8._0_2_ = CONCAT11(bVar4,local_c8._0_1_);
    pVVar8 = Json::Value::operator[](pVVar7,"permissions");
    Json::Value::asString_abi_cxx11_(&local_140,pVVar8);
    std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    pVVar8 = Json::Value::operator[](pVVar7,"message-level");
    Json::Value::asString_abi_cxx11_(&local_140,pVVar8);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    pVVar7 = Json::Value::operator[](pVVar7,"script-location");
    Json::Value::asString_abi_cxx11_(&local_140,pVVar7);
    std::__cxx11::string::operator=((string *)&local_80,(string *)&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    std::optional<CxxModuleBmiInstall>::operator=
              ((optional<CxxModuleBmiInstall> *)(*(long *)this + 0x30),
               (CxxModuleBmiInstall *)&local_108);
    if (local_80 != &local_70) {
      operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
    }
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,CONCAT71(local_d8._M_allocated_capacity._1_7_,
                                        local_d8._M_local_buf[0]) + 1);
    }
    if (local_108 != &local_f8) {
      operator_delete(local_108.string_,(ulong)(local_f8 + 1));
    }
  }
  pVVar7 = Json::Value::operator[](local_110,"cxx-modules");
  bVar4 = Json::Value::isObject(pVVar7);
  if (bVar4) {
    local_110 = pVVar7;
    cVar9 = Json::Value::begin(pVVar7);
    local_40.current_ = cVar9.super_ValueIteratorBase.current_._M_node;
    local_40.isNull_ = cVar9.super_ValueIteratorBase.isNull_;
    while( true ) {
      cVar9 = Json::Value::end(local_110);
      local_108.int_ = (LargestInt)cVar9.super_ValueIteratorBase.current_._M_node;
      local_100 = CONCAT71(local_100._1_7_,cVar9.super_ValueIteratorBase.isNull_);
      bVar4 = Json::ValueIteratorBase::isEqual(&local_40,(SelfType *)&local_108);
      if (bVar4) break;
      this_01 = *(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>_>
                  **)this;
      Json::ValueIteratorBase::key((Value *)&local_108,&local_40);
      Json::Value::asString_abi_cxx11_(&local_140,(Value *)&local_108);
      this_02 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>_>
                ::operator[](this_01,&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      Json::Value::~Value((Value *)&local_108);
      pVVar7 = Json::ValueIteratorBase::deref(&local_40);
      pVVar8 = Json::Value::operator[](pVVar7,"name");
      Json::Value::asString_abi_cxx11_((String *)&local_108,pVVar8);
      std::__cxx11::string::operator=((string *)this_02,(string *)&local_108.bool_);
      if (local_108 != &local_f8) {
        operator_delete(local_108.string_,(ulong)(local_f8 + 1));
      }
      pVVar8 = Json::Value::operator[](pVVar7,"bmi-only");
      bVar4 = Json::Value::asBool(pVVar8);
      this_02->BmiOnly = bVar4;
      pVVar8 = Json::Value::operator[](pVVar7,"relative-directory");
      Json::Value::asString_abi_cxx11_((String *)&local_108,pVVar8);
      this_00 = &this_02->RelativeDirectory;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_108.bool_);
      if (local_108 != &local_f8) {
        operator_delete(local_108.string_,(ulong)(local_f8 + 1));
      }
      pcVar2 = (pointer)(this_02->RelativeDirectory)._M_string_length;
      if ((pcVar2 != (pointer)0x0) &&
         (pcVar3 = (this_00->_M_dataplus)._M_p, pcVar2[(long)(pcVar3 + -1)] != '/')) {
        local_140.field_2._M_allocated_capacity = 0;
        local_108.int_ = 0;
        local_100 = 1;
        local_120 = local_f0;
        local_f0[0] = 0x2f;
        local_140.field_2._8_8_ = 1;
        local_118 = 0;
        views._M_len = 2;
        views._M_array = (iterator)&local_140;
        local_140._M_dataplus._M_p = pcVar2;
        local_140._M_string_length = (size_type)pcVar3;
        local_f8 = local_120;
        cmCatViews((string *)local_60,views);
        std::__cxx11::string::operator=((string *)this_00,(string *)local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._0_8_ != &local_50) {
          operator_delete((void *)local_60._0_8_,local_50._M_allocated_capacity + 1);
        }
      }
      pVVar8 = Json::Value::operator[](pVVar7,"source");
      Json::Value::asString_abi_cxx11_((String *)&local_108,pVVar8);
      std::__cxx11::string::operator=((string *)&this_02->SourcePath,(string *)&local_108.bool_);
      if (local_108 != &local_f8) {
        operator_delete(local_108.string_,(ulong)(local_f8 + 1));
      }
      pVVar8 = Json::Value::operator[](pVVar7,"type");
      Json::Value::asString_abi_cxx11_((String *)&local_108,pVVar8);
      std::__cxx11::string::operator=((string *)&this_02->Type,(string *)&local_108.bool_);
      if (local_108 != &local_f8) {
        operator_delete(local_108.string_,(ulong)(local_f8 + 1));
      }
      pVVar8 = Json::Value::operator[](pVVar7,"visibility");
      Json::Value::asString_abi_cxx11_((String *)&local_108,pVVar8);
      name._M_str = local_108.string_;
      name._M_len = local_100;
      cVar5 = cmFileSetVisibilityFromName(name,(cmMakefile *)0x0);
      this_02->Visibility = cVar5;
      if (local_108 != &local_f8) {
        operator_delete(local_108.string_,(ulong)(local_f8 + 1));
      }
      pVVar7 = Json::Value::operator[](pVVar7,"destination");
      bVar4 = Json::Value::isString(pVVar7);
      if (bVar4) {
        Json::Value::asString_abi_cxx11_((String *)&local_108,pVVar7);
        std::optional<std::__cxx11::string>::operator=
                  ((optional<std::__cxx11::string> *)&this_02->Destination,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108);
        if (local_108 != &local_f8) {
          operator_delete(local_108.string_,(ulong)(local_f8 + 1));
        }
      }
      Json::ValueIteratorBase::increment(&local_40);
    }
  }
  return (__uniq_ptr_data<cmCxxModuleExportInfo,_cmCxxModuleExportInfoDeleter,_true,_true>)
         (__uniq_ptr_data<cmCxxModuleExportInfo,_cmCxxModuleExportInfoDeleter,_true,_true>)this;
}

Assistant:

std::unique_ptr<cmCxxModuleExportInfo, cmCxxModuleExportInfoDeleter>
cmDyndepCollation::ParseExportInfo(Json::Value const& tdi)
{
  auto export_info =
    std::unique_ptr<cmCxxModuleExportInfo, cmCxxModuleExportInfoDeleter>(
      new cmCxxModuleExportInfo);

  export_info->Config = tdi["config"].asString();
  if (export_info->Config.empty()) {
    export_info->Config = "noconfig";
  }
  Json::Value const& tdi_exports = tdi["exports"];
  if (tdi_exports.isArray()) {
    for (auto const& tdi_export : tdi_exports) {
      CxxModuleExport exp;
      exp.Install = tdi_export["install"].asBool();
      exp.Name = tdi_export["export-name"].asString();
      exp.Destination = tdi_export["destination"].asString();
      exp.Prefix = tdi_export["export-prefix"].asString();
      exp.CxxModuleInfoDir = tdi_export["cxx-module-info-dir"].asString();
      exp.Namespace = tdi_export["namespace"].asString();

      export_info->Exports.push_back(exp);
    }
  }
  auto const& bmi_installation = tdi["bmi-installation"];
  if (bmi_installation.isObject()) {
    CxxModuleBmiInstall bmi_install;

    bmi_install.Component = bmi_installation["component"].asString();
    bmi_install.Destination = bmi_installation["destination"].asString();
    bmi_install.ExcludeFromAll = bmi_installation["exclude-from-all"].asBool();
    bmi_install.Optional = bmi_installation["optional"].asBool();
    bmi_install.Permissions = bmi_installation["permissions"].asString();
    bmi_install.MessageLevel = bmi_installation["message-level"].asString();
    bmi_install.ScriptLocation =
      bmi_installation["script-location"].asString();

    export_info->BmiInstallation = bmi_install;
  }
  Json::Value const& tdi_cxx_modules = tdi["cxx-modules"];
  if (tdi_cxx_modules.isObject()) {
    for (auto i = tdi_cxx_modules.begin(); i != tdi_cxx_modules.end(); ++i) {
      CxxModuleFileSet& fsi = export_info->ObjectToFileSet[i.key().asString()];
      auto const& tdi_cxx_module_info = *i;
      fsi.Name = tdi_cxx_module_info["name"].asString();
      fsi.BmiOnly = tdi_cxx_module_info["bmi-only"].asBool();
      fsi.RelativeDirectory =
        tdi_cxx_module_info["relative-directory"].asString();
      if (!fsi.RelativeDirectory.empty() &&
          fsi.RelativeDirectory.back() != '/') {
        fsi.RelativeDirectory = cmStrCat(fsi.RelativeDirectory, '/');
      }
      fsi.SourcePath = tdi_cxx_module_info["source"].asString();
      fsi.Type = tdi_cxx_module_info["type"].asString();
      fsi.Visibility = cmFileSetVisibilityFromName(
        tdi_cxx_module_info["visibility"].asString(), nullptr);
      auto const& tdi_fs_dest = tdi_cxx_module_info["destination"];
      if (tdi_fs_dest.isString()) {
        fsi.Destination = tdi_fs_dest.asString();
      }
    }
  }

  return export_info;
}